

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::ParsedIR::get_decoration(ParsedIR *this,ID id,Decoration decoration)

{
  Meta *pMVar1;
  ulong uVar2;
  FPRoundingMode FVar3;
  Decoration local_1c;
  
  pMVar1 = find_meta(this,id);
  FVar3 = FPRoundingModeRTE;
  if (pMVar1 != (Meta *)0x0) {
    if (decoration < 0x40) {
      uVar2 = 1L << ((byte)decoration & 0x3f) & (pMVar1->decoration).decoration_flags.lower;
    }
    else {
      local_1c = decoration;
      uVar2 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(pMVar1->decoration).decoration_flags.higher._M_h,&local_1c);
    }
    FVar3 = FPRoundingModeRTE;
    if (uVar2 != 0) {
      FVar3 = FPRoundingModeRTZ;
      if ((int)decoration < 0xb) {
        if (decoration == DecorationSpecId) {
          FVar3 = (pMVar1->decoration).spec_id;
        }
        else if (decoration == DecorationArrayStride) {
          FVar3 = (pMVar1->decoration).array_stride;
        }
        else if (decoration == DecorationMatrixStride) {
          FVar3 = (pMVar1->decoration).matrix_stride;
        }
      }
      else {
        switch(decoration) {
        case DecorationStream:
          FVar3 = (pMVar1->decoration).stream;
          break;
        case DecorationLocation:
          FVar3 = (pMVar1->decoration).location;
          break;
        case DecorationComponent:
          FVar3 = (pMVar1->decoration).component;
          break;
        case DecorationIndex:
          FVar3 = (pMVar1->decoration).index;
          break;
        case DecorationBinding:
          FVar3 = (pMVar1->decoration).binding;
          break;
        case DecorationDescriptorSet:
          FVar3 = (pMVar1->decoration).set;
          break;
        case DecorationOffset:
          FVar3 = (pMVar1->decoration).offset;
          break;
        case DecorationXfbBuffer:
          FVar3 = (pMVar1->decoration).xfb_buffer;
          break;
        case DecorationXfbStride:
          FVar3 = (pMVar1->decoration).xfb_stride;
          break;
        case DecorationFuncParamAttr:
        case DecorationFPFastMathMode:
        case DecorationLinkageAttributes:
        case DecorationNoContraction:
          break;
        case DecorationFPRoundingMode:
          FVar3 = (pMVar1->decoration).fp_rounding_mode;
          break;
        case DecorationInputAttachmentIndex:
          FVar3 = (pMVar1->decoration).input_attachment;
          break;
        default:
          if (decoration == DecorationBuiltIn) {
            FVar3 = (pMVar1->decoration).builtin_type;
          }
        }
      }
    }
  }
  return FVar3;
}

Assistant:

uint32_t ParsedIR::get_decoration(ID id, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (!m)
		return 0;

	auto &dec = m->decoration;
	if (!dec.decoration_flags.get(decoration))
		return 0;

	switch (decoration)
	{
	case DecorationBuiltIn:
		return dec.builtin_type;
	case DecorationLocation:
		return dec.location;
	case DecorationComponent:
		return dec.component;
	case DecorationOffset:
		return dec.offset;
	case DecorationXfbBuffer:
		return dec.xfb_buffer;
	case DecorationXfbStride:
		return dec.xfb_stride;
	case DecorationStream:
		return dec.stream;
	case DecorationBinding:
		return dec.binding;
	case DecorationDescriptorSet:
		return dec.set;
	case DecorationInputAttachmentIndex:
		return dec.input_attachment;
	case DecorationSpecId:
		return dec.spec_id;
	case DecorationArrayStride:
		return dec.array_stride;
	case DecorationMatrixStride:
		return dec.matrix_stride;
	case DecorationIndex:
		return dec.index;
	case DecorationFPRoundingMode:
		return dec.fp_rounding_mode;
	default:
		return 1;
	}
}